

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

char * OSErrorString(void)

{
  int *piVar1;
  char *src;
  
  piVar1 = __errno_location();
  src = strerror(*piVar1);
  eoserv_strlcpy(ErrorBuf,src,0x400);
  return ErrorBuf;
}

Assistant:

const char *OSErrorString()
{
	eoserv_strlcpy(ErrorBuf, strerror(errno), sizeof(ErrorBuf));
	return ErrorBuf;
}